

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::StackVar,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::StackVar,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],StackVar *u,char (*args) [7],StackVar *args_1,
          char (*args_2) [8],StackVar *args_3,char (*args_4) [8],Newline *args_5)

{
  Newline *u_00;
  
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"wasm_rt_load_exception(",0x17);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)(ulong)*(uint *)*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,".tag, ",6);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)(ulong)u->index);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,".size, ",7);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)(ulong)*(uint *)*args);
  Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>(this,(char (*) [8])".data);",u_00);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }